

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlBufDumpEntityDecl(xmlBufPtr buf,xmlEntityPtr ent)

{
  xmlBufferPtr buf_00;
  
  buf_00 = xmlBufferCreate();
  if (buf_00 != (xmlBufferPtr)0x0) {
    xmlDumpEntityDecl(buf_00,ent);
    xmlBufMergeBuffer(buf,buf_00);
    return;
  }
  return;
}

Assistant:

void
xmlBufDumpEntityDecl(xmlBufPtr buf, xmlEntityPtr ent) {
    xmlBufferPtr buffer;

    buffer = xmlBufferCreate();
    if (buffer == NULL) {
        /*
         * TODO set the error in buf
         */
        return;
    }
    xmlDumpEntityDecl(buffer, ent);
    xmlBufMergeBuffer(buf, buffer);
}